

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isalpha.c
# Opt level: O3

int main(void)

{
  ushort **ppuVar1;
  ushort *puVar2;
  
  ppuVar1 = __ctype_b_loc();
  puVar2 = *ppuVar1;
  if ((*(byte *)((long)puVar2 + 0xc3) & 4) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1a,"isalpha( \'a\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0xf5) & 4) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1b,"isalpha( \'z\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0x41) & 4) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1c,"! isalpha( \' \' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 99) & 4) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1d,"! isalpha( \'1\' )");
    puVar2 = *ppuVar1;
  }
  if ((*(byte *)((long)puVar2 + 0x81) & 4) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isalpha.c, line %d - %s\n"
           ,0x1e,"! isalpha( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isalpha( 'a' ) );
    TESTCASE( isalpha( 'z' ) );
    TESTCASE( ! isalpha( ' ' ) );
    TESTCASE( ! isalpha( '1' ) );
    TESTCASE( ! isalpha( '@' ) );
    return TEST_RESULTS;
}